

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# behaviour_dictionary.c
# Opt level: O2

void test_bhdct_update_all(planck_unit_test_t *tc)

{
  uint uVar1;
  int iVar2;
  undefined4 local_b8;
  int local_b4 [3];
  undefined4 local_a8;
  uint local_a4 [3];
  ion_dictionary_t dict;
  ion_dictionary_handler_t handler;
  
  bhdct_setup(tc,&handler,&dict,ion_fill_edge_cases);
  for (uVar1 = 0; uVar1 != 10; uVar1 = uVar1 + 1) {
    local_a4[1] = 0xfffffac7;
    local_a4[2] = uVar1;
    bhdct_update(tc,&dict,local_a4 + 2,local_a4 + 1,'\0',1,'\x01');
  }
  for (uVar1 = 0x32; uVar1 < 100; uVar1 = uVar1 + 2) {
    local_a8 = 0xfffffac7;
    local_a4[0] = uVar1;
    bhdct_update(tc,&dict,local_a4,&local_a8,'\0',1,'\x01');
  }
  for (uVar1 = 500; uVar1 < 1000; uVar1 = uVar1 + 5) {
    local_b4[1] = 0xfffffac7;
    local_b4[2] = uVar1;
    bhdct_update(tc,&dict,local_b4 + 2,local_b4 + 1,'\0',1,'\x01');
  }
  for (iVar2 = -100; iVar2 < -0x32; iVar2 = iVar2 + 2) {
    local_b8 = 0xfffffac7;
    local_b4[0] = iVar2;
    bhdct_update(tc,&dict,local_b4,&local_b8,'\0',1,'\x01');
  }
  bhdct_takedown(tc,&dict);
  return;
}

Assistant:

void
test_bhdct_update_all(
	planck_unit_test_t *tc
) {
	ion_dictionary_handler_t	handler;
	ion_dictionary_t			dict;

	bhdct_setup(tc, &handler, &dict, ion_fill_edge_cases);

	int i;

	ION_FILL_LOW_LOOP(i) {
		bhdct_update(tc, &dict, IONIZE(i, int), IONIZE(-1337, int), err_ok, 1, boolean_true);
	}
	ION_FILL_MEDIUM_LOOP(i) {
		bhdct_update(tc, &dict, IONIZE(i, int), IONIZE(-1337, int), err_ok, 1, boolean_true);
	}
	ION_FILL_HIGH_LOOP(i) {
		bhdct_update(tc, &dict, IONIZE(i, int), IONIZE(-1337, int), err_ok, 1, boolean_true);
	}
	ION_FILL_EDGE_LOOP(i) {
		bhdct_update(tc, &dict, IONIZE(i, int), IONIZE(-1337, int), err_ok, 1, boolean_true);
	}

	bhdct_takedown(tc, &dict);
}